

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall
cfd::core::Psbt::SetTxInWitnessUtxoDirect(Psbt *this,uint32_t index,TxOutReference *txout)

{
  void *pvVar1;
  int iVar2;
  uint64_t satoshi;
  uchar *script_00;
  size_type script_len;
  undefined8 uVar3;
  Amount AVar4;
  AbstractTxOutReference *in_stack_fffffffffffffe48;
  Script *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined8 in_stack_fffffffffffffe68;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffe70;
  CfdException *this_00;
  allocator local_141;
  string local_140 [32];
  CfdSourceLocation local_120;
  undefined1 local_102;
  undefined1 local_101 [33];
  CfdSourceLocation local_e0;
  int64_t local_c8;
  undefined1 local_c0;
  Amount local_b8;
  int local_a8 [2];
  int ret;
  ByteData local_98;
  undefined1 local_80 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  Script script;
  wally_tx_output *output;
  wally_psbt *psbt_pointer;
  TxOutReference *txout_local;
  uint32_t index_local;
  Psbt *this_local;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  (*this->_vptr_Psbt[2])(this,(ulong)index,0x92a,"SetTxInWitnessUtxoDirect");
  pvVar1 = this->wally_psbt_pointer_;
  script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AbstractTxOutReference::GetLockingScript(in_stack_fffffffffffffe48);
  Script::GetData(&local_98,
                  (Script *)
                  &script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,&local_98);
  ByteData::~ByteData((ByteData *)0x49ac97);
  AVar4 = AbstractTxOutReference::GetValue(&txout->super_AbstractTxOutReference);
  local_c8 = AVar4.amount_;
  local_c0 = AVar4.ignore_check_;
  local_b8.amount_ = local_c8;
  local_b8.ignore_check_ = (bool)local_c0;
  satoshi = Amount::GetSatoshiValue(&local_b8);
  script_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x49ad08);
  script_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
  local_a8[0] = wally_tx_output_init_alloc
                          (satoshi,script_00,script_len,
                           (wally_tx_output **)
                           &script.script_stack_.
                            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_a8[0] != 0) {
    local_e0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_e0.filename = local_e0.filename + 1;
    local_e0.line = 0x935;
    local_e0.funcname = "SetTxInWitnessUtxoDirect";
    logger::warn<int&>(&local_e0,"wally_tx_output_init_alloc NG[{}]",local_a8);
    local_102 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    this_00 = (CfdException *)local_101;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(local_101 + 1),"psbt alloc output error.",(allocator *)this_00);
    CfdException::CfdException
              (this_00,(CfdError)((ulong)uVar3 >> 0x20),
               (string *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    local_102 = 0;
    __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  iVar2 = wally_psbt_input_set_witness_utxo
                    ((wally_psbt_input *)(*(long *)((long)pvVar1 + 0x10) + (ulong)index * 0x110),
                     (wally_tx_output *)
                     script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_a8[0] = iVar2;
  wally_tx_output_free
            ((wally_tx_output *)
             script.script_stack_.
             super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_a8[0] != 0) {
    local_120.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_120.filename = local_120.filename + 1;
    local_120.line = 0x93d;
    local_120.funcname = "SetTxInWitnessUtxoDirect";
    logger::warn<int&>(&local_120,"wally_psbt_input_set_witness_utxo NG[{}]",local_a8);
    uVar3 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_140,"psbt add witness utxo error.",&local_141);
    CfdException::CfdException
              (in_stack_fffffffffffffe70,error_code,
               (string *)CONCAT44(iVar2,in_stack_fffffffffffffe60));
    __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(iVar2,in_stack_fffffffffffffe60));
  Script::~Script(in_stack_fffffffffffffe50);
  return;
}

Assistant:

void Psbt::SetTxInWitnessUtxoDirect(
    uint32_t index, const TxOutReference &txout) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  struct wally_tx_output *output = nullptr;
  auto script = txout.GetLockingScript();
  auto script_val = script.GetData().GetBytes();
  int ret = wally_tx_output_init_alloc(
      static_cast<uint64_t>(txout.GetValue().GetSatoshiValue()),
      script_val.data(), script_val.size(), &output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_output_init_alloc NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt alloc output error.");
  }

  ret =
      wally_psbt_input_set_witness_utxo(&psbt_pointer->inputs[index], output);
  wally_tx_output_free(output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_input_set_witness_utxo NG[{}]", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "psbt add witness utxo error.");
  }
}